

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ipc_messages.cpp
# Opt level: O0

int test_ipcmsg_testresults(ITesting *t)

{
  pointer *this;
  bool bVar1;
  __type_conflict4 _Var2;
  int iVar3;
  element_type *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar4;
  kTRContinueMode tr_temp_res_3;
  kTRContinueMode tr_temp_res_2;
  IPCBinaryDecoder decoder;
  IPCTestResults testResultsIn;
  UTest_IPC_VectorReader vectorReader;
  kTRContinueMode tr_temp_res_1;
  undefined1 local_118 [4];
  kTRContinueMode tr_temp_res;
  IPCBinaryEncoder encoder;
  IPCBufferedWriter bufferedWriter;
  UTest_IPC_VectorWriter vectorWriter;
  IPCTestResults testResultsOut;
  allocator<char> local_49;
  string local_48 [32];
  undefined1 local_28 [8];
  Ref tr;
  ITesting *t_local;
  
  tr.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)t;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,"test_module_case",&local_49);
  trun::TestResult::Create((string *)local_28);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  this_00 = std::__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_28);
  trun::TestResult::SetResult(this_00,kTestResult_Pass);
  gnilk::IPCTestResults::IPCTestResults
            ((IPCTestResults *)
             ((long)&vectorWriter.data.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4),(Ref *)local_28);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &testResultsOut.super_IPCDeserializer,"test_module_case");
  this = &bufferedWriter.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage;
  UTest_IPC_VectorWriter::UTest_IPC_VectorWriter((UTest_IPC_VectorWriter *)this);
  gnilk::IPCBufferedWriter::IPCBufferedWriter
            ((IPCBufferedWriter *)&encoder.writer,(IPCWriter *)this);
  gnilk::IPCBinaryEncoder::IPCBinaryEncoder
            ((IPCBinaryEncoder *)local_118,(IPCWriter *)&encoder.writer);
  bVar1 = gnilk::IPCTestResults::Marshal
                    ((IPCTestResults *)
                     ((long)&vectorWriter.data.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                     (IPCEncoderBase *)local_118);
  if ((bVar1) ||
     (iVar3 = (*(code *)tr.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi[3]._vptr__Sp_counted_base)
                        (0x48,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                         ,"testResultsOut.Marshal(encoder)"), iVar3 != 0)) {
    gnilk::IPCBufferedWriter::Flush((IPCBufferedWriter *)&encoder.writer);
    pvVar4 = UTest_IPC_VectorWriter::Data
                       ((UTest_IPC_VectorWriter *)
                        &bufferedWriter.data.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(pvVar4);
    if ((bVar1) &&
       (iVar3 = (*(code *)tr.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi[3]._vptr__Sp_counted_base)
                          (0x4b,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                           ,"!vectorWriter.Data().empty()"), iVar3 == 0)) {
      t_local._4_4_ = 0x10;
    }
    else {
      pvVar4 = UTest_IPC_VectorWriter::Data
                         ((UTest_IPC_VectorWriter *)
                          &bufferedWriter.data.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage);
      UTest_IPC_VectorReader::UTest_IPC_VectorReader
                ((UTest_IPC_VectorReader *)
                 &testResultsIn.assertError.assertErrors.
                  super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar4);
      gnilk::IPCTestResults::IPCTestResults((IPCTestResults *)&decoder.deserializer);
      gnilk::IPCBinaryDecoder::IPCBinaryDecoder
                ((IPCBinaryDecoder *)&tr_temp_res_3,
                 (IPCReader *)
                 &testResultsIn.assertError.assertErrors.
                  super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (IPCDeserializer *)&testResultsIn);
      bVar1 = gnilk::IPCBinaryDecoder::Process((IPCBinaryDecoder *)&tr_temp_res_3);
      if ((bVar1) ||
         (iVar3 = (*(code *)tr.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi[3]._vptr__Sp_counted_base)
                            (0x52,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                             ,"decoder.Process()"), iVar3 != 0)) {
        _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&testResultsIn.super_IPCDeserializer,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&testResultsOut.super_IPCDeserializer);
        if ((_Var2) ||
           (iVar3 = (*(code *)tr.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi[3]._vptr__Sp_counted_base)
                              (0x54,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                               ,"testResultsIn.symbolName == testResultsOut.symbolName"), iVar3 != 0
           )) {
          t_local._4_4_ = 0;
        }
        else {
          t_local._4_4_ = 0x10;
        }
      }
      else {
        t_local._4_4_ = 0x10;
      }
      gnilk::IPCTestResults::~IPCTestResults((IPCTestResults *)&decoder.deserializer);
    }
  }
  else {
    t_local._4_4_ = 0x10;
  }
  gnilk::IPCBufferedWriter::~IPCBufferedWriter((IPCBufferedWriter *)&encoder.writer);
  UTest_IPC_VectorWriter::~UTest_IPC_VectorWriter
            ((UTest_IPC_VectorWriter *)
             &bufferedWriter.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  gnilk::IPCTestResults::~IPCTestResults
            ((IPCTestResults *)
             ((long)&vectorWriter.data.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4));
  std::shared_ptr<trun::TestResult>::~shared_ptr((shared_ptr<trun::TestResult> *)local_28);
  return t_local._4_4_;
}

Assistant:

DLL_EXPORT int test_ipcmsg_testresults(ITesting *t) {

    auto tr = trun::TestResult::Create("test_module_case");
    tr->SetResult(trun::kTestResult::kTestResult_Pass);

    gnilk::IPCTestResults testResultsOut(tr);
    testResultsOut.symbolName = "test_module_case";

    UTest_IPC_VectorWriter vectorWriter;
    gnilk::IPCBufferedWriter bufferedWriter(vectorWriter);
    gnilk::IPCBinaryEncoder encoder(bufferedWriter);

    // Serialize
    TR_ASSERT(t, testResultsOut.Marshal(encoder));

    bufferedWriter.Flush();
    TR_ASSERT(t, !vectorWriter.Data().empty());

    // Deserialize again
    UTest_IPC_VectorReader vectorReader(vectorWriter.Data());
    gnilk::IPCTestResults testResultsIn;
    gnilk::IPCBinaryDecoder decoder(vectorReader, testResultsIn);

    TR_ASSERT(t, decoder.Process());

    TR_ASSERT(t, testResultsIn.symbolName == testResultsOut.symbolName);

    return kTR_Pass;
}